

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRBitMatrixParser.cpp
# Opt level: O0

ByteArray *
ZXing::QRCode::ReadCodewords(BitMatrix *bitMatrix,Version *version,FormatInformation *formatInfo)

{
  Type TVar1;
  Version *in_RDX;
  ByteArray *in_RDI;
  FormatInformation *in_stack_00000068;
  Version *in_stack_00000070;
  BitMatrix *in_stack_00000078;
  Version *in_stack_00000080;
  BitMatrix *in_stack_00000088;
  
  TVar1 = Version::type(in_RDX);
  switch(TVar1) {
  case Model1:
    ReadQRCodewordsModel1
              (in_stack_00000088,in_stack_00000080,(FormatInformation *)in_stack_00000078);
    break;
  case Model2:
    ReadQRCodewords(in_stack_00000078,in_stack_00000070,in_stack_00000068);
    break;
  case Micro:
    ReadMQRCodewords(in_stack_00000088,in_stack_00000080,(FormatInformation *)in_stack_00000078);
    break;
  case rMQR:
    ReadRMQRCodewords(in_stack_00000078,in_stack_00000070,in_stack_00000068);
    break;
  default:
    memset(in_RDI,0,0x18);
    ByteArray::ByteArray((ByteArray *)0x2e7380);
  }
  return in_RDI;
}

Assistant:

ByteArray ReadCodewords(const BitMatrix& bitMatrix, const Version& version, const FormatInformation& formatInfo)
{
	switch (version.type()) {
	case Type::Micro: return ReadMQRCodewords(bitMatrix, version, formatInfo);
	case Type::rMQR: return ReadRMQRCodewords(bitMatrix, version, formatInfo);
	case Type::Model1: return ReadQRCodewordsModel1(bitMatrix, version, formatInfo);
	case Type::Model2: return ReadQRCodewords(bitMatrix, version, formatInfo);
	}

	return {};
}